

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator=(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *this,table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *x)

{
  size_t sVar1;
  value_type_pointer pbVar2;
  size_t sVar3;
  arrays_holder_type ah;
  arrays_holder_type local_40;
  
  if (this != x) {
    clear(this);
    make_empty_arrays(&local_40,x);
    delete_arrays(this,&this->arrays);
    sVar3 = (x->arrays).groups_size_index;
    sVar1 = (x->arrays).groups_size_mask;
    pbVar2 = (x->arrays).elements_;
    (this->arrays).groups_ = (x->arrays).groups_;
    (this->arrays).elements_ = pbVar2;
    (this->arrays).groups_size_index = sVar3;
    (this->arrays).groups_size_mask = sVar1;
    sVar3 = (x->size_ctrl).size;
    (this->size_ctrl).ml = (x->size_ctrl).ml;
    (this->size_ctrl).size = sVar3;
    local_40.released_ = true;
    (x->arrays).groups_ = local_40.arrays_.groups_;
    (x->arrays).elements_ = local_40.arrays_.elements_;
    (x->arrays).groups_size_index = local_40.arrays_.groups_size_index;
    (x->arrays).groups_size_mask = local_40.arrays_.groups_size_mask;
    sVar3 = initial_max_load(x);
    (x->size_ctrl).ml = sVar3;
    (x->size_ctrl).size = 0;
    arrays_holder<boost::unordered::detail::foa::table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~arrays_holder(&local_40);
  }
  return this;
}

Assistant:

table_core& operator=(table_core&& x) noexcept(
        (alloc_traits::propagate_on_container_move_assignment::value ||
         alloc_traits::is_always_equal::value) &&
        !uses_fancy_pointers) {
        BOOST_UNORDERED_STATIC_ASSERT_HASH_PRED(Hash, Pred)

        static constexpr auto pocma = alloc_traits::propagate_on_container_move_assignment::value;

        if (this != std::addressof(x)) {
            /* Given ambiguity in implementation strategies briefly discussed here:
             * https://www.open-std.org/jtc1/sc22/wg21/docs/lwg-active.html#2227
             *
             * we opt into requiring nothrow swappability and eschew the move
             * operations associated with Hash, Pred.
             *
             * To this end, we ensure that the user never has to consider the
             * moved-from state of their Hash, Pred objects
             */

            using std::swap;

            clear();

            if (pocma || al() == x.al()) {
                auto ah = x.make_empty_arrays();
                swap(h(), x.h());
                swap(pred(), x.pred());
                delete_arrays(arrays);
                move_assign_if<pocma>(al(), x.al());
                arrays = x.arrays;
                size_ctrl.ml = std::size_t(x.size_ctrl.ml);
                size_ctrl.size = std::size_t(x.size_ctrl.size);
                BOOST_UNORDERED_COPY_STATS(cstats, x.cstats);
                x.arrays = ah.release();
                x.size_ctrl.ml = x.initial_max_load();
                x.size_ctrl.size = 0;
                BOOST_UNORDERED_RESET_STATS_OF(x);
            }
            else {
                swap(h(), x.h());
                swap(pred(), x.pred());

                /* noshrink: favor memory reuse over tightness */
                noshrink_reserve(x.size());
                clear_on_exit c{x};
                (void)c;
                BOOST_UNORDERED_RESET_STATS_OF(x);

                /* This works because subsequent x.clear() does not depend on the
                 * elements' values.
                 */
                x.for_all_elements([this](element_type* p) {
                    unchecked_insert(type_policy::move(type_policy::value_from(*p)));
                });
            }
        }
        return *this;
    }